

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

void sptk::world::InitializeInverseComplexFFT(int fft_size,InverseComplexFFT *inverse_complex_fft)

{
  undefined8 uVar1;
  fft_complex *in;
  fft_complex *out;
  long lVar2;
  fft_plan *pfVar3;
  fft_plan *pfVar4;
  ulong uVar5;
  byte bVar6;
  fft_plan fStack_68;
  
  bVar6 = 0;
  inverse_complex_fft->fft_size = fft_size;
  uVar5 = 0xffffffffffffffff;
  if (-1 < fft_size) {
    uVar5 = (ulong)(uint)fft_size << 4;
  }
  in = (fft_complex *)operator_new__(uVar5);
  inverse_complex_fft->input = in;
  out = (fft_complex *)operator_new__(uVar5);
  inverse_complex_fft->output = out;
  fft_plan_dft_1d(&fStack_68,fft_size,in,out,2,3);
  pfVar3 = &fStack_68;
  pfVar4 = &inverse_complex_fft->inverse_fft;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *(undefined8 *)pfVar3;
    pfVar4->n = (int)uVar1;
    pfVar4->sign = (int)((ulong)uVar1 >> 0x20);
    pfVar3 = (fft_plan *)((long)pfVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pfVar4 = (fft_plan *)((long)pfVar4 + (ulong)bVar6 * -0x10 + 8);
  }
  return;
}

Assistant:

void InitializeInverseComplexFFT(int fft_size,
    InverseComplexFFT *inverse_complex_fft) {
  inverse_complex_fft->fft_size = fft_size;
  inverse_complex_fft->input = new fft_complex[fft_size];
  inverse_complex_fft->output = new fft_complex[fft_size];
  inverse_complex_fft->inverse_fft = fft_plan_dft_1d(fft_size,
    inverse_complex_fft->input, inverse_complex_fft->output,
    FFT_BACKWARD, FFT_ESTIMATE);
}